

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O2

void __thiscall
Transaction_AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll_Test::
~Transaction_AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll_Test
          (Transaction_AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll_Test
           *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Transaction, AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll) {
  Transaction tx(exp_version, exp_locktime);
  EXPECT_NO_THROW(
      tx.AddTxIn(
          Txid(
              "d4470b3c4b616042e5004b1ab60cb1734d21b8e1c4854c379ec8c3f7ca1e450f"),
          0, 4294967294));

  // AddScriptWitnessStack
  EXPECT_NO_THROW(tx.AddScriptWitnessStack(0, ByteData("1122334455667788")));
  EXPECT_NO_THROW(
      tx.AddScriptWitnessStack(
          0, ByteData160("1122334455667788990011223344556677889900")));
  EXPECT_NO_THROW(
      tx.AddScriptWitnessStack(
          0,
          ByteData256(
              "90a56135d400c93950da221773a0b6e1fe06c37482945ee97e4c92f7017aa385")));
  EXPECT_THROW(tx.AddScriptWitnessStack(3, ByteData("aaaa")), CfdException);

  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 3);
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str(),
      "1122334455667788");
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[1].GetHex().c_str(),
      "1122334455667788990011223344556677889900");
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[2].GetHex().c_str(),
      "90a56135d400c93950da221773a0b6e1fe06c37482945ee97e4c92f7017aa385");

  // SetScriptWitnessStack
  EXPECT_NO_THROW(tx.SetScriptWitnessStack(0, 0, ByteData("ffff")));
  EXPECT_NO_THROW(
      tx.SetScriptWitnessStack(
          0, 1, ByteData160("1111222233334444555566667777888899990000")));
  EXPECT_NO_THROW(
      tx.SetScriptWitnessStack(
          0,
          2,
          ByteData256(
              "1111222233334444555566667777888899990000111122223333444455556666")));
  EXPECT_THROW(tx.SetScriptWitnessStack(2, 0, ByteData("aaaa")), CfdException);
  EXPECT_THROW(tx.SetScriptWitnessStack(0, 4, ByteData("bbbb")), CfdException);

  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 3);
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str(),
      "ffff");
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[1].GetHex().c_str(),
      "1111222233334444555566667777888899990000");
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[2].GetHex().c_str(),
      "1111222233334444555566667777888899990000111122223333444455556666");

  // RemoveScriptWitnessStackAll
  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 3);
  EXPECT_THROW(tx.RemoveScriptWitnessStackAll(3), CfdException);
  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 3);

  EXPECT_NO_THROW(tx.RemoveScriptWitnessStackAll(0));
  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 0);
}